

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicInputLCase1::Run(BasicInputLCase1 *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  GLuint i;
  GLuint index;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  this_00 = &(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  index = 0;
  do {
    glu::CallLogWrapper::glVertexAttribL4d(this_00,index,0.0,0.0,0.0,0.0);
    index = index + 1;
  } while (index != 8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x60,(void *)0x0,0x88e4);
  local_50 = 0x3ff0000000000000;
  local_48 = 0x4000000000000000;
  local_40 = 0x4008000000000000;
  local_38 = 0x4010000000000000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,0x20,&local_50);
  local_50 = 0x4014000000000000;
  local_48 = 0x4018000000000000;
  local_40 = 0x401c000000000000;
  local_38 = 0x4020000000000000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x20,0x20,&local_50);
  local_50 = 0x4022000000000000;
  local_48 = 0x4024000000000000;
  local_40 = 0x4026000000000000;
  local_38 = 0x4028000000000000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x40,0x20,&local_50);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glVertexAttribLFormat(this_00,0,4,0x140a,0);
  glu::CallLogWrapper::glVertexAttribLFormat(this_00,3,3,0x140a,8);
  glu::CallLogWrapper::glVertexAttribLFormat(this_00,5,2,0x140a,0);
  glu::CallLogWrapper::glVertexAttribLFormat(this_00,7,1,0x140a,0x18);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,3,2);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,5,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,7,6);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,3);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,5);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,7);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,0x20);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,2,this->m_vbo,0,0x10);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,6,this->m_vbo,0x10,0);
  (this->super_BasicInputLBase).expected_data[0].m_data[0] = 1.0;
  (this->super_BasicInputLBase).expected_data[0].m_data[1] = 2.0;
  (this->super_BasicInputLBase).expected_data[0].m_data[2] = 3.0;
  (this->super_BasicInputLBase).expected_data[0].m_data[3] = 4.0;
  (this->super_BasicInputLBase).expected_data[3].m_data[0] = 2.0;
  (this->super_BasicInputLBase).expected_data[3].m_data[1] = 3.0;
  (this->super_BasicInputLBase).expected_data[3].m_data[2] = 4.0;
  (this->super_BasicInputLBase).expected_data[3].m_data[3] = 12345.0;
  (this->super_BasicInputLBase).expected_data[5].m_data[0] = 1.0;
  (this->super_BasicInputLBase).expected_data[5].m_data[1] = 2.0;
  (this->super_BasicInputLBase).expected_data[5].m_data[2] = 12345.0;
  (this->super_BasicInputLBase).expected_data[5].m_data[3] = 12345.0;
  (this->super_BasicInputLBase).expected_data[7].m_data[0] = 6.0;
  (this->super_BasicInputLBase).expected_data[7].m_data[1] = 12345.0;
  (this->super_BasicInputLBase).expected_data[7].m_data[2] = 12345.0;
  (this->super_BasicInputLBase).expected_data[7].m_data[3] = 12345.0;
  (this->super_BasicInputLBase).expected_data[8].m_data[0] = 5.0;
  (this->super_BasicInputLBase).expected_data[8].m_data[1] = 6.0;
  (this->super_BasicInputLBase).expected_data[8].m_data[2] = 7.0;
  (this->super_BasicInputLBase).expected_data[8].m_data[3] = 8.0;
  (this->super_BasicInputLBase).expected_data[0xb].m_data[0] = 4.0;
  (this->super_BasicInputLBase).expected_data[0xb].m_data[1] = 5.0;
  (this->super_BasicInputLBase).expected_data[0xb].m_data[2] = 6.0;
  (this->super_BasicInputLBase).expected_data[0xb].m_data[3] = 12345.0;
  (this->super_BasicInputLBase).expected_data[0xd].m_data[0] = 5.0;
  (this->super_BasicInputLBase).expected_data[0xd].m_data[1] = 6.0;
  (this->super_BasicInputLBase).expected_data[0xd].m_data[2] = 12345.0;
  (this->super_BasicInputLBase).expected_data[0xd].m_data[3] = 12345.0;
  (this->super_BasicInputLBase).expected_data[0xf].m_data[0] = 6.0;
  (this->super_BasicInputLBase).expected_data[0xf].m_data[1] = 12345.0;
  (this->super_BasicInputLBase).expected_data[0xf].m_data[2] = 12345.0;
  (this->super_BasicInputLBase).expected_data[0xf].m_data[3] = 12345.0;
  lVar1 = BasicInputLBase::Run(&this->super_BasicInputLBase);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 8; ++i)
		{
			glVertexAttribL4d(i, 0.0, 0.0, 0.0, 0.0);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(DVec4) * 3, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(DVec4), &DVec4(1.0, 2.0, 3.0, 4.0)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 32, sizeof(DVec4), &DVec4(5.0, 6.0, 7.0, 8.0)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 64, sizeof(DVec4), &DVec4(9.0, 10.0, 11.0, 12.0)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribLFormat(0, 4, GL_DOUBLE, 0);
		glVertexAttribLFormat(3, 3, GL_DOUBLE, 8);
		glVertexAttribLFormat(5, 2, GL_DOUBLE, 0);
		glVertexAttribLFormat(7, 1, GL_DOUBLE, 24);
		glVertexAttribBinding(0, 0);
		glVertexAttribBinding(3, 2);
		glVertexAttribBinding(5, 0);
		glVertexAttribBinding(7, 6);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(3);
		glEnableVertexAttribArray(5);
		glEnableVertexAttribArray(7);
		glBindVertexBuffer(0, m_vbo, 0, 32);
		glBindVertexBuffer(2, m_vbo, 0, 16);
		glBindVertexBuffer(6, m_vbo, 16, 0);

		expected_data[0]	 = DVec4(1.0, 2.0, 3.0, 4.0);
		expected_data[3]	 = DVec4(2.0, 3.0, 4.0, 12345.0);
		expected_data[5]	 = DVec4(1.0, 2.0, 12345.0, 12345.0);
		expected_data[7]	 = DVec4(6.0, 12345.0, 12345.0, 12345.0);
		expected_data[0 + 8] = DVec4(5.0, 6.0, 7.0, 8.0);
		expected_data[3 + 8] = DVec4(4.0, 5.0, 6.0, 12345.0);
		expected_data[5 + 8] = DVec4(5.0, 6.0, 12345.0, 12345.0);
		expected_data[7 + 8] = DVec4(6.0, 12345.0, 12345.0, 12345.0);
		return BasicInputLBase::Run();
	}